

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.h
# Opt level: O0

N * __thiscall N::ana<std::__cxx11::string>(N *this,CoAlg<std::__cxx11::basic_string<char>_> *coalg)

{
  N *pNVar1;
  function<N_*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RSI;
  N *r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  function<N_*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *__x;
  N *in_stack_ffffffffffffffa0;
  function<N_*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_58;
  anon_class_32_1_a7c0f4d0 *in_stack_ffffffffffffffd8;
  CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
  *in_stack_ffffffffffffffe0;
  
  std::get<std::__cxx11::string,std::__cxx11::string,int,double,NS*>
            ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
              *)0x17e95f);
  pNVar1 = std::
           function<N_*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::operator()(in_RSI,in_stack_ffffffffffffff78);
  __x = (function<N_*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         *)&stack0xffffffffffffffc8;
  all(in_stack_ffffffffffffffa0);
  std::
  function<N_*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>::
  function(&local_58,__x);
  CIt<__gnu_cxx::__normal_iterator<N**,std::vector<N*,std::allocator<N*>>>,N>::
  mapped<N::ana<std::__cxx11::string>(std::function<N*(std::__cxx11::string&)>const&)::_lambda(N*)_1_>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  ana<std::__cxx11::string>(std::function<N*(std::__cxx11::string&)>const&)::{lambda(N*)#1}::
  ~function((anon_class_32_1_a7c0f4d0 *)0x17e9b4);
  return pNVar1;
}

Assistant:

N* ana(const coalg::CoAlg<A>& coalg) {
        auto r = coalg(std::get<A>(this->data));

        r->all().mapped([coalg](N* n){return n->ana(coalg);});

        return r;
    }